

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::Int64Size(RepeatedField<long> *value)

{
  long lVar1;
  ulong *puVar2;
  int iVar3;
  size_t sVar4;
  int index;
  
  sVar4 = 0;
  iVar3 = value->current_size_;
  if (value->current_size_ < 1) {
    iVar3 = 0;
  }
  for (index = 0; iVar3 != index; index = index + 1) {
    puVar2 = (ulong *)RepeatedField<long>::Get(value,index);
    lVar1 = 0x3f;
    if ((*puVar2 | 1) != 0) {
      for (; (*puVar2 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar1 * 9 + 0x49U >> 6);
  }
  return sVar4;
}

Assistant:

size_t WireFormatLite::Int64Size(const RepeatedField<int64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += Int64Size(value.Get(i));
  }
  return out;
}